

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SerializerTest_shouldRestoreStreamState_Test::TestBody
          (SerializerTest_shouldRestoreStreamState_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_288;
  Message local_280;
  ios_base local_278 [8];
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  char local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_3;
  Message local_230;
  streamsize local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208;
  streamsize local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  Message local_1e0;
  fmtflags local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  locale saved_locale;
  char local_1b1;
  streamsize sStack_1b0;
  char_type saved_fill;
  streamsize saved_width;
  streamsize saved_precision;
  fmtflags local_18c;
  long lStack_188;
  fmtflags saved_flags;
  ostringstream os;
  SerializerTest_shouldRestoreStreamState_Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe78);
  local_18c = std::ios_base::flags
                        ((ios_base *)
                         ((long)&stack0xfffffffffffffe78 + *(long *)(lStack_188 + -0x18)));
  saved_width = std::ios_base::precision
                          ((ios_base *)
                           ((long)&stack0xfffffffffffffe78 + *(long *)(lStack_188 + -0x18)));
  sStack_1b0 = std::ios_base::width
                         ((ios_base *)
                          ((long)&stack0xfffffffffffffe78 + *(long *)(lStack_188 + -0x18)));
  local_1b1 = std::ios::fill();
  std::ios_base::getloc((ios_base *)&gtest_ar.message_);
  TextSerializer::Serialize
            (&(this->super_SerializerTest).textSerializer,(ostream *)&stack0xfffffffffffffe78,
             &(this->super_SerializerTest).collected);
  local_1d4 = std::ios_base::flags
                        ((ios_base *)
                         ((long)&stack0xfffffffffffffe78 + *(long *)(lStack_188 + -0x18)));
  testing::internal::EqHelper::Compare<std::_Ios_Fmtflags,_std::_Ios_Fmtflags,_nullptr>
            ((EqHelper *)local_1d0,"os.flags()","saved_flags",&local_1d4,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_200 = std::ios_base::precision
                        ((ios_base *)
                         ((long)&stack0xfffffffffffffe78 + *(long *)(lStack_188 + -0x18)));
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_1f8,"os.precision()","saved_precision",&local_200,&saved_width);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_228 = std::ios_base::width
                        ((ios_base *)
                         ((long)&stack0xfffffffffffffe78 + *(long *)(lStack_188 + -0x18)));
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_220,"os.width()","saved_width",&local_228,&stack0xfffffffffffffe50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_249 = std::ios::fill();
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_248,"os.fill()","saved_fill",&local_249,&local_1b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  std::ios_base::getloc(local_278);
  testing::internal::EqHelper::Compare<std::locale,_std::locale,_nullptr>
            ((EqHelper *)local_270,"os.getloc()","saved_locale",(locale *)local_278,
             (locale *)&gtest_ar.message_);
  std::locale::~locale((locale *)local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::locale::~locale((locale *)&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe78);
  return;
}

Assistant:

TEST_F(SerializerTest, shouldRestoreStreamState) {
  std::ostringstream os;

  // save stream state
  auto saved_flags = os.flags();
  auto saved_precision = os.precision();
  auto saved_width = os.width();
  auto saved_fill = os.fill();
  auto saved_locale = os.getloc();

  // serialize
  textSerializer.Serialize(os, collected);

  // check for expected flags
  EXPECT_EQ(os.flags(), saved_flags);
  EXPECT_EQ(os.precision(), saved_precision);
  EXPECT_EQ(os.width(), saved_width);
  EXPECT_EQ(os.fill(), saved_fill);
  EXPECT_EQ(os.getloc(), saved_locale);
}